

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O1

int Sbl_ManCriticalFanin(Sbl_Man_t *p,int iLut,Vec_Int_t *vFanins)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  
  if (-1 < iLut) {
    iVar1 = p->vArrs->nSize;
    if (iLut < iVar1) {
      if (0 < (long)vFanins->nSize) {
        piVar3 = p->vArrs->pArray;
        lVar4 = 0;
        do {
          iVar2 = vFanins->pArray[lVar4];
          if (((long)iVar2 < 0) || (iVar1 <= iVar2)) goto LAB_007b4cfc;
          if (piVar3[iVar2] + 1 == piVar3[(uint)iLut]) {
            return iVar2;
          }
          lVar4 = lVar4 + 1;
        } while (vFanins->nSize != lVar4);
      }
      return -1;
    }
  }
LAB_007b4cfc:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Sbl_ManCriticalFanin( Sbl_Man_t * p, int iLut, Vec_Int_t * vFanins )
{
    int k, iFan, Delay = Vec_IntEntry(p->vArrs, iLut);
    Vec_IntForEachEntry( vFanins, iFan, k )
        if ( Vec_IntEntry(p->vArrs, iFan) + 1 == Delay )
            return iFan;
    return -1;
}